

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varnode.cc
# Opt level: O1

void __thiscall Varnode::saveXml(Varnode *this,ostream *s)

{
  AddrSpace *pAVar1;
  ostream *poVar2;
  char local_49;
  char *local_48;
  long local_40;
  char local_38 [16];
  
  std::__ostream_insert<char,std::char_traits<char>>(s,"<addr",5);
  pAVar1 = (this->loc).base;
  (*pAVar1->_vptr_AddrSpace[8])(pAVar1,s,(this->loc).offset,(ulong)(uint)this->size);
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"ref","");
  local_49 = ' ';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(s,&local_49,1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_48,local_40);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"=\"0x",4);
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"",1);
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  if (this->mergegroup != 0) {
    local_48 = local_38;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"grp","");
    local_49 = ' ';
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(s,&local_49,1);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_48,local_40);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"=\"",2);
    *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
         *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"",1);
    if (local_48 != local_38) {
      operator_delete(local_48);
    }
  }
  if ((this->flags & 0x8000) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(s," persists=\"true\"",0x10);
  }
  if ((~this->flags & 0x10020) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(s," addrtied=\"true\"",0x10);
  }
  if ((this->flags & 0x20000) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(s," unaff=\"true\"",0xd);
  }
  if ((this->flags & 8) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(s," input=\"true\"",0xd);
  }
  std::__ostream_insert<char,std::char_traits<char>>(s,"/>",2);
  return;
}

Assistant:

void Varnode::saveXml(ostream &s) const

{
  s << "<addr";
  loc.getSpace()->saveXmlAttributes(s,loc.getOffset(),size);
  a_v_u(s,"ref",getCreateIndex());
  if (mergegroup != 0)
    a_v_i(s,"grp",getMergeGroup());
  if (isPersist())
    s << " persists=\"true\"";
  if (isAddrTied())
    s << " addrtied=\"true\"";
  if (isUnaffected())
    s << " unaff=\"true\"";
  if (isInput())
    s << " input=\"true\"";
  s << "/>";
}